

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O0

BackendPtr __thiscall
WaveBackendFactory::createBackend(WaveBackendFactory *this,ALCdevice *device,BackendType type)

{
  ALCdevice *device_00;
  int in_ECX;
  tuple<BackendBase_*,_std::default_delete<BackendBase>_> in_RDI;
  nullptr_t in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<BackendBase,_std::default_delete<BackendBase>_> this_00;
  
  if (in_ECX == 0) {
    this_00._M_t.super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>.
    super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl =
         (tuple<BackendBase_*,_std::default_delete<BackendBase>_>)
         (tuple<BackendBase_*,_std::default_delete<BackendBase>_>)
         in_RDI.super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>.
         super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl;
    device_00 = (ALCdevice *)
                (anonymous_namespace)::WaveBackend::operator_new
                          ((size_t)in_RDI.
                                   super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>
                                   .super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl);
    anon_unknown.dwarf_253962::WaveBackend::WaveBackend
              ((WaveBackend *)
               this_00._M_t.super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>
               .super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl,device_00);
    std::unique_ptr<BackendBase,std::default_delete<BackendBase>>::
    unique_ptr<std::default_delete<BackendBase>,void>
              ((unique_ptr<BackendBase,_std::default_delete<BackendBase>_> *)
               this_00._M_t.super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>
               .super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl,(pointer)device_00);
  }
  else {
    std::unique_ptr<BackendBase,std::default_delete<BackendBase>>::
    unique_ptr<std::default_delete<BackendBase>,void>
              ((unique_ptr<BackendBase,_std::default_delete<BackendBase>_> *)
               in_RDI.super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>.
               super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl,in_stack_ffffffffffffffc8);
  }
  return (__uniq_ptr_data<BackendBase,_std::default_delete<BackendBase>,_true,_true>)
         (__uniq_ptr_data<BackendBase,_std::default_delete<BackendBase>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_BackendBase_*,_std::default_delete<BackendBase>_>.
         super__Head_base<0UL,_BackendBase_*,_false>._M_head_impl;
}

Assistant:

BackendPtr WaveBackendFactory::createBackend(ALCdevice *device, BackendType type)
{
    if(type == BackendType::Playback)
        return BackendPtr{new WaveBackend{device}};
    return nullptr;
}